

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegenTest.cpp
# Opt level: O0

void __thiscall
TestRegenerateCmakeAddTarget_LibraryAlias::Run(TestRegenerateCmakeAddTarget_LibraryAlias *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  byte bVar1;
  runtime_error *this_00;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar2;
  __type v;
  ostringstream oss;
  string expectedOutput;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  bool isHeaderOnly;
  Configuration config;
  Component comp;
  Component *in_stack_fffffffffffff830;
  value_type *in_stack_fffffffffffff838;
  undefined7 in_stack_fffffffffffff840;
  undefined1 in_stack_fffffffffffff847;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff848;
  Component *in_stack_fffffffffffff850;
  undefined7 in_stack_fffffffffffff858;
  undefined1 in_stack_fffffffffffff85f;
  path *in_stack_fffffffffffff860;
  allocator *paVar3;
  iterator in_stack_fffffffffffff868;
  size_type in_stack_fffffffffffff870;
  string *psVar4;
  string *local_788;
  path *in_stack_fffffffffffff8a8;
  Component *in_stack_fffffffffffff8b0;
  string local_720 [39];
  byte local_6f9;
  ostringstream local_6f8 [152];
  Configuration *in_stack_fffffffffffff9a0;
  allocator local_579;
  string local_578 [36];
  undefined1 local_554;
  allocator local_553;
  allocator local_552;
  allocator local_551;
  string *local_550;
  string local_548 [32];
  string local_528 [32];
  string local_508 [32];
  string *local_4e8;
  undefined8 local_4e0;
  undefined1 local_4b9;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_4b8;
  undefined1 local_4b0;
  allocator local_4a1;
  string local_4a0 [1056];
  string local_80 [48];
  string local_50 [80];
  
  boost::filesystem::path::path
            (in_stack_fffffffffffff860,
             (value_type *)CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858));
  Component::Component(in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
  boost::filesystem::path::~path((path *)0x15840f);
  std::__cxx11::string::operator=(local_80,"add_library_alias");
  std::__cxx11::string::operator=(local_50,"  EXCLUDE_FROM_ALL\n");
  Configuration::Configuration(in_stack_fffffffffffff9a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a0,"add_library_alias",&local_4a1);
  pVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffff847,in_stack_fffffffffffff840),
                   in_stack_fffffffffffff838);
  local_4b8._M_cur =
       (__node_type *)
       pVar2.first.
       super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
       ._M_cur;
  local_4b0 = pVar2.second;
  std::__cxx11::string::~string(local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  local_4b9 = 0;
  local_554 = 1;
  psVar4 = local_548;
  paVar3 = &local_551;
  local_550 = psVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(psVar4,"Analysis.cpp",paVar3);
  local_550 = local_528;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_528,"Analysis.h",&local_552);
  local_550 = local_508;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_508,"main.cpp",&local_553);
  local_554 = 0;
  local_4e8 = local_548;
  local_4e0 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x1585fa);
  __l._M_len = in_stack_fffffffffffff870;
  __l._M_array = in_stack_fffffffffffff868;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffff860,__l,
         (allocator_type *)CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x15862b);
  psVar4 = local_548;
  local_788 = (string *)&local_4e8;
  do {
    local_788 = local_788 + -0x20;
    std::__cxx11::string::~string(local_788);
  } while (local_788 != psVar4);
  std::allocator<char>::~allocator((allocator<char> *)&local_553);
  std::allocator<char>::~allocator((allocator<char> *)&local_552);
  std::allocator<char>::~allocator((allocator<char> *)&local_551);
  paVar3 = &local_579;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_578,
             "add_library_alias(${PROJECT_NAME} STATIC\n  Analysis.cpp\n  Analysis.h\n  main.cpp\n  EXCLUDE_FROM_ALL\n)\n\n"
             ,paVar3);
  std::allocator<char>::~allocator((allocator<char> *)&local_579);
  std::__cxx11::ostringstream::ostringstream(local_6f8);
  RegenerateCmakeAddTarget
            ((ostream *)paVar3,
             (Configuration *)CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),
             in_stack_fffffffffffff850,
             (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff848,(bool)in_stack_fffffffffffff847);
  std::__cxx11::ostringstream::str();
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  std::__cxx11::string::~string(local_720);
  local_6f9 = bVar1 & 1;
  if (local_6f9 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed: oss.str() == expectedOutput");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::~ostringstream(local_6f8);
  std::__cxx11::string::~string(local_578);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x1589f2);
  Configuration::~Configuration((Configuration *)in_stack_fffffffffffff830);
  Component::~Component(in_stack_fffffffffffff830);
  return;
}

Assistant:

TEST(RegenerateCmakeAddTarget_LibraryAlias) {
  Component comp("./MyComponent/");
  comp.type = "add_library_alias";
  comp.additionalTargetParameters = "  EXCLUDE_FROM_ALL\n";

  Configuration config;
  config.addLibraryAliases.insert("add_library_alias");

  bool isHeaderOnly = false;

  const std::list<std::string> files{
    "Analysis.cpp",
    "Analysis.h",
    "main.cpp"
  };

  const std::string expectedOutput(
      "add_library_alias(${PROJECT_NAME} STATIC\n"
      "  Analysis.cpp\n"
      "  Analysis.h\n"
      "  main.cpp\n"
      "  EXCLUDE_FROM_ALL\n"
      ")\n"
      "\n");

  std::ostringstream oss;
  RegenerateCmakeAddTarget(oss, config, comp, files, isHeaderOnly);

  ASSERT(oss.str() == expectedOutput);
}